

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMeshControl.h
# Opt level: O2

void __thiscall TPZMHMeshControl::TPZMHMeshControl(TPZMHMeshControl *this,int dimension)

{
  TPZAutoPointer<TPZGeoMesh> *this_00;
  _Rb_tree_header *p_Var1;
  TPZGeoMesh *this_01;
  TPZCompMesh *pTVar2;
  
  this->_vptr_TPZMHMeshControl = (_func_int **)&PTR__TPZMHMeshControl_01815f70;
  this_00 = &this->fGMesh;
  TPZAutoPointer<TPZGeoMesh>::TPZAutoPointer(this_00);
  TPZAutoPointer<TPZCompMesh>::TPZAutoPointer(&this->fCMesh);
  TPZAutoPointer<TPZCompMesh>::TPZAutoPointer(&this->fCMeshLagrange);
  TPZAutoPointer<TPZCompMesh>::TPZAutoPointer(&this->fCMeshConstantPressure);
  TPZAutoPointer<TPZCompMesh>::TPZAutoPointer(&this->fPressureFineMesh);
  this->fProblemType = EScalar;
  this->fNState = 1;
  this->fSkeletonMatId = 4;
  this->fSecondSkeletonMatId = 3;
  this->fPressureSkeletonMatId = 6;
  this->fLagrangeMatIdLeft = 0x226;
  this->fLagrangeMatIdRight = 0x227;
  p_Var1 = &(this->fMaterialIds)._M_t._M_impl.super__Rb_tree_header;
  (this->fMaterialIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->fMaterialIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->fMaterialIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->fMaterialIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->fMaterialIds)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->fMaterialBCIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->fMaterialBCIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->fMaterialBCIds)._M_t._M_impl.super__Rb_tree_header;
  (this->fMaterialBCIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->fMaterialBCIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->fMaterialBCIds)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->fpOrderInternal = 1;
  this->fpOrderSkeleton = 1;
  this->fHdivmaismais = 0;
  this->fSkeletonWrapMatId = 500;
  this->fBoundaryWrapMatId = 0x1f6;
  this->fInternalWrapMatId = 0x1f5;
  TPZManVector<long,_10>::TPZManVector(&this->fGeoToMHMDomain,0);
  p_Var1 = &(this->fMHMtoSubCMesh)._M_t._M_impl.super__Rb_tree_header;
  *(undefined1 (*) [16])&(this->fMHMtoSubCMesh)._M_t._M_impl = (undefined1  [16])0x0;
  (this->fMHMtoSubCMesh)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->fMHMtoSubCMesh)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->fMHMtoSubCMesh)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->fMHMtoSubCMesh)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->fInterfaces)._M_t._M_impl.super__Rb_tree_header;
  (this->fInterfaces)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->fInterfaces)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->fInterfaces)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->fInterfaces)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->fInterfaces)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->fConnectToSubDomainIdentifier)._M_t._M_impl.super__Rb_tree_header;
  (this->fConnectToSubDomainIdentifier)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->fConnectToSubDomainIdentifier)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->fConnectToSubDomainIdentifier)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->fConnectToSubDomainIdentifier)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->fConnectToSubDomainIdentifier)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined4 *)
   ((long)&(this->fConnectToSubDomainIdentifier)._M_t._M_impl.super__Rb_tree_header._M_node_count +
   7) = 0;
  *(undefined4 *)&this->fGlobalSystemSize = 0xffffffff;
  *(undefined4 *)((long)&this->fGlobalSystemSize + 4) = 0xffffffff;
  *(undefined4 *)&this->fGlobalSystemWithLocalCondensationSize = 0xffffffff;
  *(undefined4 *)((long)&this->fGlobalSystemWithLocalCondensationSize + 4) = 0xffffffff;
  this->fNumeq = -1;
  this_01 = (TPZGeoMesh *)operator_new(0x2a8);
  TPZGeoMesh::TPZGeoMesh(this_01);
  TPZAutoPointer<TPZGeoMesh>::operator=(this_00,this_01);
  this_00->fRef->fPointer->fDim = dimension;
  pTVar2 = (TPZCompMesh *)operator_new(0x918);
  TPZCompMesh::TPZCompMesh(pTVar2,this_00,false);
  TPZAutoPointer<TPZCompMesh>::operator=(&this->fCMesh,pTVar2);
  pTVar2 = (TPZCompMesh *)operator_new(0x918);
  TPZCompMesh::TPZCompMesh(pTVar2,this_00,false);
  TPZAutoPointer<TPZCompMesh>::operator=(&this->fPressureFineMesh,pTVar2);
  return;
}

Assistant:

TPZMHMeshControl(int dimension) : fProblemType(EScalar), fNState(1), fGeoToMHMDomain(), fMHMtoSubCMesh(),
    fLagrangeAveragePressure(false),
    fHybridize(false), fSwitchLagrangeSign(false), fGlobalSystemSize(-1), fGlobalSystemWithLocalCondensationSize(-1), fNumeq(-1)
    {
        fGMesh = new TPZGeoMesh;
        fGMesh->SetDimension(dimension);
        fCMesh = new TPZCompMesh(fGMesh);
        fPressureFineMesh = new TPZCompMesh(fGMesh);
    }